

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void maxmin(int *a,int n,int *max,int *min)

{
  int local_44;
  int local_40;
  int local_38;
  int local_34;
  int min2;
  int max2;
  int min1;
  int max1;
  int *min_local;
  int *max_local;
  int *piStack_10;
  int n_local;
  int *a_local;
  
  if (n == 1) {
    *max = *a;
    *min = *a;
  }
  else if (n == 2) {
    if (a[1] < *a) {
      *max = *a;
      *min = a[1];
    }
    else {
      *max = a[1];
      *min = *a;
    }
  }
  else {
    _min1 = min;
    min_local = max;
    max_local._4_4_ = n;
    piStack_10 = a;
    maxmin(a,n / 2,&max2,&min2);
    maxmin(piStack_10 + max_local._4_4_ / 2,max_local._4_4_ - max_local._4_4_ / 2,&local_34,
           &local_38);
    if (local_34 < max2) {
      local_40 = max2;
    }
    else {
      local_40 = local_34;
    }
    *min_local = local_40;
    if (min2 < local_38) {
      local_44 = min2;
    }
    else {
      local_44 = local_38;
    }
    *_min1 = local_44;
  }
  return;
}

Assistant:

void maxmin(int *a,int n,int *max,int *min)
{
    int max1,min1,max2,min2;
    switch(n)
    {
        case 1: *max=a[0];
            *min=a[0];
            return;
        case 2: if(a[0]>a[1])
            {
                *max=a[0];
                *min=a[1];
            }
            else
            {
                *max=a[1];
                *min=a[0];
            }
            return;
        default:maxmin(a,n/2,&max1,&min1);
            maxmin(a+n/2,n-n/2,&max2,&min2);
            *max=(max1>max2?max1:max2);
            *min=(min1<min2?min1:min2);
            return;
    }
}